

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::inflate_stream_test::Boost::operator()
          (Boost *this,int window,string *in,string *check)

{
  Split SVar1;
  ulong uVar2;
  ulong local_78;
  size_t j;
  size_t i;
  size_t j1;
  size_t j0;
  size_t i1;
  size_t i0;
  anon_class_32_4_6ef9e63a f;
  string *check_local;
  string *in_local;
  Boost *pBStack_10;
  int window_local;
  Boost *this_local;
  
  f.in = (string *)((long)&in_local + 4);
  SVar1 = this->in_;
  i0 = (size_t)check;
  f.check = in;
  f.window = (int *)this;
  f.this = (Boost *)check;
  in_local._4_4_ = window;
  pBStack_10 = this;
  if (SVar1 == once) {
LAB_00118c8f:
    j0 = std::__cxx11::string::size();
    i1 = j0;
  }
  else if (SVar1 == half) {
    uVar2 = std::__cxx11::string::size();
    j0 = uVar2 >> 1;
    i1 = j0;
  }
  else {
    if (SVar1 != full) goto LAB_00118c8f;
    i1 = 1;
    j0 = std::__cxx11::string::size();
  }
  SVar1 = this->check_;
  if (SVar1 != once) {
    if (SVar1 == half) {
      uVar2 = std::__cxx11::string::size();
      i = uVar2 >> 1;
      j1 = i;
      goto LAB_00118d4a;
    }
    if (SVar1 == full) {
      j1 = 1;
      i = std::__cxx11::string::size();
      goto LAB_00118d4a;
    }
  }
  i = std::__cxx11::string::size();
  j1 = i;
LAB_00118d4a:
  for (j = i1; j <= j0; j = j + 1) {
    for (local_78 = j1; local_78 <= i; local_78 = local_78 + 1) {
      operator()::anon_class_32_4_6ef9e63a::operator()((anon_class_32_4_6ef9e63a *)&i0,j,local_78);
    }
  }
  return;
}

Assistant:

void operator()(
            int window,
            std::string const& in,
            std::string const& check) const
        {
            auto const f =
            [&](std::size_t i, std::size_t j)
            {
                std::string out(check.size(), 0);
                z_params zs;
                zs.next_in = in.data();
                zs.next_out = &out[0];
                zs.avail_in = i;
                zs.avail_out = j;
                inflate_stream is;
                is.reset(window);
                bool bi = i >= in.size();
                bool bo = j >= check.size();
                for(;;)
                {
                    error_code ec;
                    is.write(zs, flush_, ec);
                    if( ec == error::need_buffers ||
                        ec == error::end_of_stream)
                    {
                        out.resize(zs.total_out);
                        BOOST_TEST(out == check);
                        break;
                    }
                    if(ec)
                    {
                        BOOST_ERROR(ec.message().c_str());
                        break;
                    }
                    if(zs.avail_in == 0 && ! bi)
                    {
                        bi = true;
                        zs.avail_in = in.size() - i;
                    }
                    if(zs.avail_out == 0 && ! bo)
                    {
                        bo = true;
                        zs.avail_out = check.size() - j;
                    }
                }
            };

            std::size_t i0, i1;
            std::size_t j0, j1;

            switch(in_)
            {
            default:
            case once: i0 = in.size();     i1 = i0;         break;
            case half: i0 = in.size() / 2; i1 = i0;         break;
            case full: i0 = 1;             i1 = in.size();  break;
            }

            switch(check_)
            {
            default:
            case once: j0 = check.size();     j1 = j0;              break;
            case half: j0 = check.size() / 2; j1 = j0;              break;
            case full: j0 = 1;                j1 = check.size();    break;
            }

            for(std::size_t i = i0; i <= i1; ++i)
                for(std::size_t j = j0; j <= j1; ++j)
                    f(i, j);
        }